

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,true>>
::insert_hint_multi<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
          (btree<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,true>>
           *this,iterator position,pair<const_int,_phmap::test_internal::MovableOnlyInstance> *v)

{
  int iVar1;
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  *pbVar2;
  iterator iVar3;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
  local_38;
  
  pbVar2 = position.node;
  if (*(long *)(this + 0x10) == 0) {
LAB_00267d90:
    iVar3 = insert_multi<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
                      (this,&v->first,v);
  }
  else {
    iVar1 = position.position;
    iVar3 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
            ::end((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                   *)this);
    if (iVar3.node == pbVar2 && iVar3.position == iVar1) {
LAB_00267d4d:
      local_38.node = pbVar2;
      local_38.position = iVar1;
      iVar3 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
              ::begin((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                       *)this);
      if (iVar3.node != pbVar2 || iVar3.position != iVar1) {
        btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
        ::decrement(&local_38);
        if (((ulong)local_38.node & 7) != 0) {
LAB_00267dbd:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                        ,0xf84,
                        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                       );
        }
        if (v->first < *(int *)(local_38.node + (long)local_38.position * 0x18 + 0x10))
        goto LAB_00267d90;
      }
    }
    else {
      if (((undefined1  [16])position & (undefined1  [16])0x7) != (undefined1  [16])0x0)
      goto LAB_00267dbd;
      if (v->first <= *(int *)(pbVar2 + (long)iVar1 * 0x18 + 0x10)) goto LAB_00267d4d;
      local_38.node = pbVar2;
      local_38.position = iVar1;
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
      ::increment(&local_38);
      iVar3 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
              ::end((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                     *)this);
      pbVar2 = local_38.node;
      iVar1 = local_38.position;
      if (local_38.node != iVar3.node || local_38.position != iVar3.position) {
        if (((ulong)local_38.node & 7) != 0) goto LAB_00267dbd;
        if (*(int *)(local_38.node + (long)local_38.position * 0x18 + 0x10) < v->first)
        goto LAB_00267d90;
      }
    }
    iVar3.position = iVar1;
    iVar3.node = pbVar2;
    iVar3._12_4_ = 0;
    iVar3 = internal_emplace<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
                      (this,iVar3,v);
  }
  return iVar3;
}

Assistant:

auto btree<P>::insert_hint_multi(iterator position, ValueType &&v) -> iterator {
        if (!empty()) {
            const key_type &key = params_type::key(v);
            if (position == end() || !compare_keys(position.key(), key)) {
                iterator prev = position;
                if (position == begin() || !compare_keys(key, (--prev).key())) {
                    // prev.key() <= key <= position.key()
                    return internal_emplace(position, std::forward<ValueType>(v));
                }
            } else {
                iterator next = position;
                ++next;
                if (next == end() || !compare_keys(next.key(), key)) {
                    // position.key() < key <= next.key()
                    return internal_emplace(next, std::forward<ValueType>(v));
                }
            }
        }
        return insert_multi(std::forward<ValueType>(v));
    }